

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall lzham::symbol_codec::put_bits_init(symbol_codec *this,uint expected_size)

{
  bool bVar1;
  undefined4 in_ESI;
  vector<unsigned_char> *in_RDI;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  in_RDI[3].m_size = 0;
  in_RDI[3].m_capacity = 0;
  *(undefined4 *)&in_RDI[4].m_p = 0x40;
  vector<unsigned_char>::try_resize
            ((vector<unsigned_char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
             (uint)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  bVar1 = vector<unsigned_char>::try_reserve(in_RDI,in_stack_ffffffffffffffdc);
  return bVar1;
}

Assistant:

bool symbol_codec::put_bits_init(uint expected_size)
   {
      m_bit_buf = 0;
      m_bit_count = cBitBufSize;

      m_output_buf.try_resize(0);
      if (!m_output_buf.try_reserve(expected_size))
         return false;

      return true;
   }